

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyObj.c
# Opt level: O3

void Ivy_ObjDelete(Ivy_Man_t *p,Ivy_Obj_t *pObj,int fFreeTop)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Ivy_Obj_t *pIVar3;
  long lVar4;
  uint uVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyObj.c"
                  ,0x101,"void Ivy_ObjDelete(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  if ((fFreeTop != 0) && (pObj->nRefs != 0)) {
    __assert_fail("Ivy_ObjRefs(pObj) == 0 || !fFreeTop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyObj.c"
                  ,0x102,"void Ivy_ObjDelete(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  p->nObjs[*(uint *)&pObj->field_0x8 & 0xf] = p->nObjs[*(uint *)&pObj->field_0x8 & 0xf] + -1;
  p->nDeleted = p->nDeleted + 1;
  Ivy_ObjDisconnect(p,pObj);
  uVar5 = *(uint *)&pObj->field_0x8 & 0xf;
  if (uVar5 == 2) {
    pVVar2 = p->vPos;
    piVar6 = &pVVar2->nSize;
    uVar5 = pVVar2->nSize;
    lVar8 = (ulong)uVar5 + 1;
    do {
      if ((int)lVar8 + -1 < 1) goto LAB_007e55b4;
      lVar7 = lVar8 + -1;
      lVar4 = lVar8 + -2;
      lVar8 = lVar7;
    } while ((Ivy_Obj_t *)pVVar2->pArray[lVar4] != pObj);
    for (; (int)lVar7 < (int)uVar5; lVar7 = lVar7 + 1) {
      pVVar2->pArray[lVar7 + -1] = pVVar2->pArray[lVar7];
    }
  }
  else if (uVar5 == 1) {
    pVVar2 = p->vPis;
    piVar6 = &pVVar2->nSize;
    uVar5 = pVVar2->nSize;
    lVar8 = (ulong)uVar5 + 1;
    do {
      if ((int)lVar8 + -1 < 1) {
LAB_007e55b4:
        __assert_fail("i >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x304,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
      }
      lVar7 = lVar8 + -1;
      lVar4 = lVar8 + -2;
      lVar8 = lVar7;
    } while ((Ivy_Obj_t *)pVVar2->pArray[lVar4] != pObj);
    for (; (int)lVar7 < (int)uVar5; lVar7 = lVar7 + 1) {
      pVVar2->pArray[lVar7 + -1] = pVVar2->pArray[lVar7];
    }
  }
  else {
    if ((uVar5 != 7) || (p->fFanout == 0)) goto LAB_007e554f;
    pVVar2 = p->vBufs;
    piVar6 = &pVVar2->nSize;
    uVar5 = pVVar2->nSize;
    lVar8 = (ulong)uVar5 + 1;
    do {
      if ((int)lVar8 + -1 < 1) goto LAB_007e55b4;
      lVar7 = lVar8 + -1;
      lVar4 = lVar8 + -2;
      lVar8 = lVar7;
    } while ((Ivy_Obj_t *)pVVar2->pArray[lVar4] != pObj);
    for (; (int)lVar7 < (int)uVar5; lVar7 = lVar7 + 1) {
      pVVar2->pArray[lVar7 + -1] = pVVar2->pArray[lVar7];
    }
  }
  *piVar6 = uVar5 - 1;
LAB_007e554f:
  if (fFreeTop == 0) {
    iVar1 = pObj->Id;
    pIVar3 = pObj->pFanout;
    pObj->Id = 0;
    pObj->TravId = 0;
    *(undefined8 *)&pObj->field_0x8 = 0;
    pObj->pFanout = (Ivy_Obj_t *)0x0;
    pObj->pNextFan0 = (Ivy_Obj_t *)0x0;
    pObj->pFanin0 = (Ivy_Obj_t *)0x0;
    pObj->pFanin1 = (Ivy_Obj_t *)0x0;
    pObj->pNextFan1 = (Ivy_Obj_t *)0x0;
    pObj->pPrevFan0 = (Ivy_Obj_t *)0x0;
    pObj->pPrevFan1 = (Ivy_Obj_t *)0x0;
    pObj->pEquiv = (Ivy_Obj_t *)0x0;
    pObj->Id = iVar1;
    pObj->pFanout = pIVar3;
    pObj->nRefs = pObj->nRefs;
  }
  else {
    iVar1 = pObj->Id;
    if (((long)iVar1 < 0) || (p->vObjs->nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
    }
    p->vObjs->pArray[iVar1] = (void *)0x0;
    pObj->field_0x8 = pObj->field_0x8 & 0xf0;
    *(Ivy_Obj_t **)pObj = p->pListFree;
    p->pListFree = pObj;
  }
  return;
}

Assistant:

void Ivy_ObjDelete( Ivy_Man_t * p, Ivy_Obj_t * pObj, int fFreeTop )
{
    assert( !Ivy_IsComplement(pObj) );
    assert( Ivy_ObjRefs(pObj) == 0 || !fFreeTop );
    // update node counters of the manager
    p->nObjs[pObj->Type]--;
    p->nDeleted++;
    // remove connections
    Ivy_ObjDisconnect( p, pObj );
    // remove PIs/POs from the arrays
    if ( Ivy_ObjIsPi(pObj) )
        Vec_PtrRemove( p->vPis, pObj );
    else if ( Ivy_ObjIsPo(pObj) )
        Vec_PtrRemove( p->vPos, pObj );
    else if ( p->fFanout && Ivy_ObjIsBuf(pObj) )
        Vec_PtrRemove( p->vBufs, pObj );
    // clean and recycle the entry
    if ( fFreeTop )
    {
        // free the node
        Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
        Ivy_ManRecycleMemory( p, pObj );
    }
    else
    {
        int nRefsOld = pObj->nRefs;
        Ivy_Obj_t * pFanout = pObj->pFanout;
        Ivy_ObjClean( pObj );
        pObj->pFanout = pFanout;
        pObj->nRefs = nRefsOld;
    }
}